

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Tetris::same(Tetris *this,Tetris *x)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  int iVar4;
  int (*paiVar5) [8];
  long lVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  bool bVar9;
  pair<int,_int> pVar10;
  pair<int,_int> hash [4];
  
  if (this->blockType != x->blockType) {
    return false;
  }
  hash[2].first = 0;
  hash[2].second = 0;
  hash[3].first = 0;
  hash[3].second = 0;
  hash[0].first = 0;
  hash[0].second = 0;
  hash[1].first = 0;
  hash[1].second = 0;
  iVar4 = this->orientation;
  uVar1 = this->blockX;
  uVar3 = this->blockY;
  paiVar5 = this->shape;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    uVar2 = *(undefined8 *)(paiVar5[iVar4] + lVar6 * 2);
    pVar10.first = (int)uVar2 + uVar1;
    pVar10.second = (int)((ulong)uVar2 >> 0x20) + uVar3;
    hash[lVar6] = pVar10;
  }
  uVar8 = 0;
  do {
    uVar7 = uVar8;
    if (uVar7 == 4) break;
    uVar8 = 0;
    bVar9 = false;
    while ((uVar8 < 4 && (!bVar9))) {
      if (hash[uVar8].first == x->shape[x->orientation][uVar7 * 2] + x->blockX) {
        bVar9 = hash[uVar8].second == x->shape[x->orientation][uVar7 * 2 + 1] + x->blockY;
      }
      else {
        bVar9 = false;
      }
      uVar8 = uVar8 + 1;
    }
    uVar8 = uVar7 + 1;
  } while (bVar9);
  return 3 < uVar7;
}

Assistant:

bool Tetris::same(const Tetris &x)
{
    if (blockType != x.blockType)
        return false;
    pair<int, int> hash[4];
    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        hash[i].first = tmpX, hash[i].second = tmpY;
    }
    for (i = 0; i < 4; i++) {
        tmpX = x.blockX + x.shape[x.orientation][2 * i];
        tmpY = x.blockY + x.shape[x.orientation][2 * i + 1];
        bool ok = false;
        for (int j = 0; j < 4 && !ok; ++j)
            if (hash[j].first == tmpX && hash[j].second == tmpY)
                ok = true;
        if (!ok)
            return false;
    }
    return true;
}